

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

UINT8 ym2608_timer_over(void *chip,UINT8 c)

{
  int iVar1;
  undefined7 in_register_00000031;
  
  iVar1 = (int)CONCAT71(in_register_00000031,c);
  if (iVar1 == 0) {
    ym2608_update_req(chip);
    TimerAOver((FM_ST *)((long)chip + 0x210));
    if ((*(uint *)((long)chip + 0x230) & 0xc0) == 0x80) {
      CSMKeyControl((FM_OPN *)((long)chip + 0x208),(FM_CH *)((long)chip + 0x4aa8));
    }
  }
  else if (iVar1 == 1) {
    TimerBOver((FM_ST *)((long)chip + 0x210));
  }
  return *(UINT8 *)((long)chip + 0x22d);
}

Assistant:

UINT8 ym2608_timer_over(void *chip,UINT8 c)
{
	YM2608 *F2608 = (YM2608 *)chip;

	switch(c)
	{
#if 0
	case 2:
		{   /* BUFRDY flag */
			YM_DELTAT_BRDY_callback( &F2608->deltaT );
		}
		break;
#endif
	case 1:
		{   /* Timer B */
			TimerBOver( &(F2608->OPN.ST) );
		}
		break;
	case 0:
		{   /* Timer A */
			ym2608_update_req(F2608);
			/* timer update */
			TimerAOver( &(F2608->OPN.ST) );
			/* CSM mode key,TL control */
			if ((F2608->OPN.ST.mode & 0xc0) == 0x80)
			{   /* CSM mode total level latch and auto key on */
				CSMKeyControl( &F2608->OPN, &(F2608->CH[2]) );
			}
		}
		break;
	default:
		break;
	}

	return F2608->OPN.ST.irq;
}